

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

int __thiscall Fl_Menu_Item_Type::flags(Fl_Menu_Item_Type *this)

{
  byte bVar1;
  char cVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  uint local_14;
  int i;
  Fl_Menu_Item_Type *this_local;
  
  bVar1 = Fl_Widget::type((this->super_Fl_Widget_Type).o);
  local_14 = (uint)bVar1;
  cVar2 = Fl_Button::value((Fl_Button *)(this->super_Fl_Widget_Type).o);
  if (cVar2 != '\0') {
    local_14 = local_14 | 4;
  }
  uVar4 = Fl_Widget::active((this->super_Fl_Widget_Type).o);
  if (uVar4 == 0) {
    local_14 = local_14 | 1;
  }
  uVar4 = Fl_Widget::visible((this->super_Fl_Widget_Type).o);
  if (uVar4 == 0) {
    local_14 = local_14 | 0x10;
  }
  iVar5 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x16])();
  if (iVar5 != 0) {
    pcVar6 = Fl_Type::user_data((Fl_Type *)this);
    if (pcVar6 == (char *)0x0) {
      local_14 = local_14 | 0x40;
    }
    else {
      local_14 = local_14 | 0x20;
    }
  }
  uVar3 = Fl_Widget_Type::hotspot(&this->super_Fl_Widget_Type);
  if (uVar3 != '\0') {
    local_14 = local_14 | 0x80;
  }
  return local_14;
}

Assistant:

int Fl_Menu_Item_Type::flags() {
  int i = o->type();
  if (((Fl_Button*)o)->value()) i |= FL_MENU_VALUE;
  if (!o->active()) i |= FL_MENU_INACTIVE;
  if (!o->visible()) i |= FL_MENU_INVISIBLE;
  if (is_parent()) {
    if (user_data() == NULL) i |= FL_SUBMENU;
    else i |= FL_SUBMENU_POINTER;
  }
  if (hotspot()) i |= FL_MENU_DIVIDER;
  return i;
}